

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeEditor.cxx
# Opt level: O3

int CodeEditor::auto_indent(int param_1,CodeEditor *e)

{
  uint *puVar1;
  Fl_Text_Buffer *pFVar2;
  int start;
  int iVar3;
  char *__s;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  
  pFVar2 = (e->super_Fl_Text_Editor).super_Fl_Text_Display.mBuffer;
  if ((pFVar2->mPrimary).mSelected != false) {
    Fl_Text_Display::insert_position((Fl_Text_Display *)e,(pFVar2->mPrimary).mStart);
    Fl_Text_Buffer::remove_selection((e->super_Fl_Text_Editor).super_Fl_Text_Display.mBuffer);
  }
  iVar3 = (e->super_Fl_Text_Editor).super_Fl_Text_Display.mCursorPos;
  start = Fl_Text_Display::line_start((Fl_Text_Display *)e,iVar3);
  __s = Fl_Text_Buffer::text_range
                  ((e->super_Fl_Text_Editor).super_Fl_Text_Display.mBuffer,start,iVar3);
  pcVar5 = __s;
  do {
    pcVar6 = pcVar5;
    iVar3 = isspace((int)*pcVar6);
    pcVar5 = pcVar6 + 1;
  } while (iVar3 != 0);
  *pcVar6 = '\0';
  if (*__s == '\0') {
    Fl_Text_Display::insert((Fl_Text_Display *)e,"\n");
  }
  else {
    sVar4 = strlen(__s);
    pcVar5 = (char *)malloc((long)((int)sVar4 + 2));
    *pcVar5 = '\n';
    strcpy(pcVar5 + 1,__s);
    Fl_Text_Display::insert((Fl_Text_Display *)e,pcVar5);
    free(pcVar5);
  }
  Fl_Text_Display::show_insert_position((Fl_Text_Display *)e);
  puVar1 = &(e->super_Fl_Text_Editor).super_Fl_Text_Display.super_Fl_Group.super_Fl_Widget.flags_;
  *(byte *)puVar1 = (byte)*puVar1 | 0x80;
  if (((e->super_Fl_Text_Editor).super_Fl_Text_Display.super_Fl_Group.super_Fl_Widget.when_ & 1) !=
      0) {
    Fl_Widget::do_callback
              ((Fl_Widget *)e,(Fl_Widget *)e,
               (e->super_Fl_Text_Editor).super_Fl_Text_Display.super_Fl_Group.super_Fl_Widget.
               user_data_);
  }
  free(__s);
  return 1;
}

Assistant:

int CodeEditor::auto_indent(int, CodeEditor* e) {
  if (e->buffer()->selected()) {
    e->insert_position(e->buffer()->primary_selection()->start());
    e->buffer()->remove_selection();
  }

  int pos = e->insert_position();
  int start = e->line_start(pos);
  char *text = e->buffer()->text_range(start, pos);
  char *ptr;

  for (ptr = text; isspace(*ptr); ptr ++) {/*empty*/}
  *ptr = '\0';  
  if (*text) {
    // use only a single 'insert' call to avoid redraw issues
    int n = strlen(text);
    char *b = (char*)malloc(n+2);
    *b = '\n';
    strcpy(b+1, text);
    e->insert(b);
    free(b);
  } else {
    e->insert("\n");
  }
  e->show_insert_position();
  e->set_changed();
  if (e->when()&FL_WHEN_CHANGED) e->do_callback();

  free(text);

  return 1;
}